

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsNaN(double x)

{
  bool local_21;
  u64 y;
  int rc;
  double x_local;
  
  local_21 = ((ulong)x & 0x7ff0000000000000) == 0x7ff0000000000000 &&
             ((ulong)x & 0xfffffffffffff) != 0;
  return (uint)local_21;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsNaN(double x){
  int rc;   /* The value return */
#if !SQLITE_HAVE_ISNAN && !HAVE_ISNAN
  u64 y;
  memcpy(&y,&x,sizeof(y));
  rc = IsNaN(y);
#else
  rc = isnan(x);
#endif /* HAVE_ISNAN */
  testcase( rc );
  return rc;
}